

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_TestOneofSpaceUsed_Test::
TestBody(GeneratedMessageTest_TestOneofSpaceUsed_Test *this)

{
  bool bVar1;
  FooCase FVar2;
  int iVar3;
  TestOneof2 *__p;
  pointer pTVar4;
  char *pcVar5;
  Arena *pAVar6;
  TestOneof2_NestedMessage *this_00;
  AssertHelper local_1a8;
  Message local_1a0;
  size_t local_198;
  unsigned_long local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_170;
  Message local_168;
  size_t local_160;
  unsigned_long local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_4;
  Message local_138;
  size_t local_130;
  unsigned_long local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_3;
  int min_expected_increase;
  AssertHelper local_e8;
  Message local_e0;
  size_t local_d8;
  unsigned_long local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  size_t local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  size_t empty_message_size;
  Message local_80 [3];
  size_t local_68;
  unsigned_long local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
  message1;
  GeneratedMessageTest_TestOneofSpaceUsed_Test *this_local;
  
  __p = Arena::Create<proto2_unittest::TestOneof2>((Arena *)0x0);
  std::unique_ptr<proto2_unittest::TestOneof2,std::default_delete<proto2_unittest::TestOneof2>>::
  unique_ptr<std::default_delete<proto2_unittest::TestOneof2>,void>
            ((unique_ptr<proto2_unittest::TestOneof2,std::default_delete<proto2_unittest::TestOneof2>>
              *)&gtest_ar.message_,__p);
  local_60 = 0x40;
  pTVar4 = std::
           unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
           ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                         *)&gtest_ar.message_);
  local_68 = Message::SpaceUsedLong(&pTVar4->super_Message);
  testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
            ((internal *)local_58,"sizeof(::proto2_unittest::TestOneof2)",
             "message1->SpaceUsedLong()",&local_60,&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&empty_message_size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x377,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&empty_message_size,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&empty_message_size);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  pTVar4 = std::
           unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
           ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                         *)&gtest_ar.message_);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Message::SpaceUsedLong(&pTVar4->super_Message);
  pTVar4 = std::
           unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
           ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                         *)&gtest_ar.message_);
  proto2_unittest::TestOneof2::set_foo_int(pTVar4,0x7b);
  pTVar4 = std::
           unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
           ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                         *)&gtest_ar.message_);
  proto2_unittest::TestOneof2::set_bar_int(pTVar4,0x3039);
  pTVar4 = std::
           unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
           ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                         *)&gtest_ar.message_);
  local_a8 = Message::SpaceUsedLong(&pTVar4->super_Message);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_a0,"empty_message_size","message1->SpaceUsedLong()",
             (unsigned_long *)&gtest_ar_1.message_,&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x37d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  pTVar4 = std::
           unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
           ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                         *)&gtest_ar.message_);
  FVar2 = proto2_unittest::TestOneof2::foo_case(pTVar4);
  if (FVar2 != kFooString) {
    proto2_unittest::TestOneof2::clear_foo(pTVar4);
    proto2_unittest::TestOneof2::set_has_foo_string(pTVar4);
    protobuf::internal::ArenaStringPtr::InitDefault(&(pTVar4->field_0)._impl_.foo_.foo_string_);
  }
  pAVar6 = protobuf::MessageLite::GetArena((MessageLite *)pTVar4);
  protobuf::internal::ArenaStringPtr::Set(&(pTVar4->field_0)._impl_.foo_.foo_string_,"abc",pAVar6);
  local_d0 = (long)gtest_ar_1.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl + 0x20;
  pTVar4 = std::
           unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
           ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                         *)&gtest_ar.message_);
  local_d8 = Message::SpaceUsedLong(&pTVar4->super_Message);
  testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
            ((internal *)local_c8,"empty_message_size + sizeof(std::string)",
             "message1->SpaceUsedLong()",&local_d0,&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x382,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  pTVar4 = std::
           unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
           ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&min_expected_increase,0x21,'x',
             (allocator<char> *)
             ((long)&gtest_ar_3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  FVar2 = proto2_unittest::TestOneof2::foo_case(pTVar4);
  if (FVar2 != kFooString) {
    proto2_unittest::TestOneof2::clear_foo(pTVar4);
    proto2_unittest::TestOneof2::set_has_foo_string(pTVar4);
    protobuf::internal::ArenaStringPtr::InitDefault(&(pTVar4->field_0)._impl_.foo_.foo_string_);
  }
  pAVar6 = protobuf::MessageLite::GetArena((MessageLite *)pTVar4);
  protobuf::internal::ArenaStringPtr::Set
            (&(pTVar4->field_0)._impl_.foo_.foo_string_,(string *)&min_expected_increase,pAVar6);
  std::__cxx11::string::~string((string *)&min_expected_increase);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pTVar4 = std::
           unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
           ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                         *)&gtest_ar.message_);
  proto2_unittest::TestOneof2::foo_string_abi_cxx11_(pTVar4);
  iVar3 = std::__cxx11::string::capacity();
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = iVar3 + 0x20;
  local_128 = (long)gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl +
              (long)(int)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
  pTVar4 = std::
           unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
           ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                         *)&gtest_ar.message_);
  local_130 = Message::SpaceUsedLong(&pTVar4->super_Message);
  testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
            ((internal *)local_120,"empty_message_size + min_expected_increase",
             "message1->SpaceUsedLong()",&local_128,&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x38b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  pTVar4 = std::
           unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
           ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                         *)&gtest_ar.message_);
  proto2_unittest::TestOneof2::mutable_foo_message(pTVar4);
  local_158 = 0x38;
  pTVar4 = std::
           unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
           ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                         *)&gtest_ar.message_);
  this_00 = proto2_unittest::TestOneof2::foo_message(pTVar4);
  local_160 = Message::SpaceUsedLong(&this_00->super_Message);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_150,"sizeof(::proto2_unittest::TestOneof2::NestedMessage)",
             "message1->foo_message().SpaceUsedLong()",&local_158,&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x393,pcVar5);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message(&local_168);
  }
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  if (gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_190 = (long)gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x38;
    pTVar4 = std::
             unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
             ::operator->((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
                           *)&gtest_ar.message_);
    local_198 = Message::SpaceUsedLong(&pTVar4->super_Message);
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((internal *)local_188,
               "empty_message_size + sizeof(::proto2_unittest::TestOneof2::NestedMessage)",
               "message1->SpaceUsedLong()",&local_190,&local_198);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(&local_1a0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x395,pcVar5);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      testing::Message::~Message(&local_1a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    gtest_ar_5.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  std::unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>::
  ~unique_ptr((unique_ptr<proto2_unittest::TestOneof2,_std::default_delete<proto2_unittest::TestOneof2>_>
               *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, TestOneofSpaceUsed) {
  // Allocate explicitly on the heap to prevent arena creation.
  std::unique_ptr<UNITTEST::TestOneof2> message1(
      Arena::Create<UNITTEST::TestOneof2>(nullptr));
  EXPECT_LE(sizeof(UNITTEST::TestOneof2), message1->SpaceUsedLong());

  const size_t empty_message_size = message1->SpaceUsedLong();
  // Setting primitive types shouldn't affect the space used.
  message1->set_foo_int(123);
  message1->set_bar_int(12345);
  EXPECT_EQ(empty_message_size, message1->SpaceUsedLong());

  // Setting a string in oneof to a small value should only increase
  // SpaceUsedLong() by the size of a string object.
  message1->set_foo_string("abc");
  EXPECT_LE(empty_message_size + sizeof(std::string), message1->SpaceUsedLong());

  // Setting a string in oneof to a value larger than the string object itself
  // should increase SpaceUsedLong(), because it cannot store the value
  // internally.
  message1->set_foo_string(std::string(sizeof(std::string) + 1, 'x'));
  int min_expected_increase =
      message1->foo_string().capacity() + sizeof(std::string);
  EXPECT_LE(empty_message_size + min_expected_increase,
            message1->SpaceUsedLong());

  // Setting a message in oneof should delete the other fields and increase the
  // size by the size of the nested message type. NestedMessage is simple enough
  // that it is equal to sizeof(NestedMessage). It may be backed by LazyField,
  // increasing space used by LazyField and backing Cord.
  message1->mutable_foo_message();
  ASSERT_EQ(sizeof(UNITTEST::TestOneof2::NestedMessage),
            message1->foo_message().SpaceUsedLong());
  EXPECT_LE(empty_message_size + sizeof(UNITTEST::TestOneof2::NestedMessage),
            message1->SpaceUsedLong());
}